

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O1

void SerializeToVector<DataStream,CompactSizeWriter>(DataStream *s,CompactSizeWriter *args)

{
  long lVar1;
  ulong uVar2;
  uint64_t nSize;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = args->n;
  nSize = 1;
  if ((0xfc < uVar2) && (nSize = 3, 0xffff < uVar2)) {
    nSize = (ulong)(uVar2 >> 0x20 != 0) * 4 + 5;
  }
  WriteCompactSize<DataStream>(s,nSize);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    WriteCompactSize<DataStream>(s,args->n);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeToVector(Stream& s, const X&... args)
{
    SizeComputer sizecomp;
    SerializeMany(sizecomp, args...);
    WriteCompactSize(s, sizecomp.size());
    SerializeMany(s, args...);
}